

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O1

TString * __thiscall
glslang::TIntermOperator::getCompleteString_abi_cxx11_
          (TString *__return_storage_ptr__,TIntermOperator *this)

{
  TString name;
  TString structName;
  TPrecisionQualifier TVar1;
  TPoolAllocator *pTVar2;
  TPoolAllocator *pTVar3;
  TPrecisionQualifier TVar4;
  char *__s;
  char *__end;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 *puVar5;
  undefined1 in_stack_ffffffffffffff90 [24];
  undefined1 *puVar6;
  undefined1 local_40 [16];
  
  pTVar2 = GetThreadPoolAllocator();
  puVar6 = local_40;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
             &stack0xffffffffffffffa8,"","");
  pTVar3 = GetThreadPoolAllocator();
  puVar5 = &stack0xffffffffffffff98;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
             &stack0xffffffffffffff80,"","");
  name._M_dataplus._M_p = (pointer)&stack0xffffffffffffff80;
  name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xffffffffffffffa8;
  name._M_string_length = in_stack_ffffffffffffff78;
  name.field_2._M_allocated_capacity = (size_type)pTVar3;
  name.field_2._8_8_ = puVar5;
  structName.field_2._M_allocated_capacity = (size_type)pTVar2;
  structName._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)SUB168(in_stack_ffffffffffffff90._0_16_,0);
  structName._M_dataplus._M_p = (pointer)SUB168(in_stack_ffffffffffffff90._0_16_,8);
  structName._M_string_length = in_stack_ffffffffffffff90._16_8_;
  structName.field_2._8_8_ = puVar6;
  TType::getCompleteString
            (__return_storage_ptr__,&(this->super_TIntermTyped).type,false,true,true,true,name,
             structName);
  TVar1 = *(uint *)&(this->super_TIntermTyped).type.qualifier.field_0x8 >> 0x19 & 7;
  TVar4 = this->operationPrecision;
  if (this->operationPrecision == EpqNone) {
    TVar4 = TVar1;
  }
  if (TVar4 != TVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (__return_storage_ptr__,", operation at ");
    TVar4 = *(uint *)&(this->super_TIntermTyped).type.qualifier.field_0x8 >> 0x19 & 7;
    if (this->operationPrecision != EpqNone) {
      TVar4 = this->operationPrecision;
    }
    if (TVar4 < 4) {
      __s = *(char **)(&DAT_00b096a8 + (ulong)TVar4 * 8);
    }
    else {
      __s = "unknown precision qualifier";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (__return_storage_ptr__,__s);
  }
  return __return_storage_ptr__;
}

Assistant:

TString getCompleteString() const
    {
        TString cs = type.getCompleteString();
        if (getOperationPrecision() != type.getQualifier().precision) {
            cs += ", operation at ";
            cs += GetPrecisionQualifierString(getOperationPrecision());
        }

        return cs;
    }